

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

void test_blocking_io_errors(config config)

{
  config config_00;
  config config_01;
  int iVar1;
  redisContext *prVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  int *piVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  byte bVar10;
  void *_reply;
  undefined8 uStackY_88;
  undefined1 auVar11 [32];
  undefined1 in_stack_ffffffffffffff80 [80];
  char *in_stack_ffffffffffffffd0;
  
  bVar10 = 0;
  puVar8 = (undefined8 *)&stack0x00000008;
  puVar9 = &uStackY_88;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + 1;
    puVar9 = puVar9 + 1;
  }
  config_00.ssl.key = in_stack_ffffffffffffffd0;
  auVar11 = in_stack_ffffffffffffff80._8_32_;
  config_00.type = in_stack_ffffffffffffff80._0_4_;
  config_00._4_4_ = in_stack_ffffffffffffff80._4_4_;
  config_00.tcp.host = (char *)auVar11._0_8_;
  config_00.tcp.port = auVar11._8_4_;
  config_00.tcp._12_4_ = auVar11._12_4_;
  config_00.tcp.timeout.tv_sec = SUB168(auVar11._16_16_,0);
  config_00.tcp.timeout.tv_usec = SUB168(auVar11._16_16_,8);
  config_00.unix_sock.path = (char *)in_stack_ffffffffffffff80._40_8_;
  config_00.ssl.host = (char *)in_stack_ffffffffffffff80._48_8_;
  config_00.ssl.port = in_stack_ffffffffffffff80._56_4_;
  config_00.ssl._12_4_ = in_stack_ffffffffffffff80._60_4_;
  config_00.ssl.ca_cert = (char *)in_stack_ffffffffffffff80._64_8_;
  config_00.ssl.cert = (char *)in_stack_ffffffffffffff80._72_8_;
  prVar2 = do_connect(config_00);
  lVar7 = redisCommand(prVar2,"INFO");
  pcVar3 = strstr(*(char **)(lVar7 + 0x20),"redis_version:");
  lVar4 = strtol(pcVar3 + 0xe,(char **)&stack0xffffffffffffffd0,10);
  lVar5 = strtol(in_stack_ffffffffffffffd0 + 1,(char **)&stack0xffffffffffffffd0,10);
  freeReplyObject(lVar7);
  tests = tests + 1;
  printf("#%02d ");
  printf("Returns I/O error when the connection is lost: ");
  lVar7 = redisCommand(prVar2,"QUIT");
  if (((int)lVar4 < 3) && (((int)lVar4 != 2 || ((int)lVar5 < 1)))) {
    if (lVar7 == 0) {
      puts("\x1b[0;32mPASSED\x1b[0;0m");
    }
    else {
      puts("\x1b[0;31mFAILED\x1b[0;0m");
      fails = fails + 1;
    }
  }
  else {
    iVar1 = strcasecmp(*(char **)(lVar7 + 0x20),"OK");
    if (iVar1 == 0) {
      iVar1 = redisGetReply(prVar2,&stack0xffffffffffffffd0);
      if (iVar1 != -1) goto LAB_00104cb4;
      puts("\x1b[0;32mPASSED\x1b[0;0m");
    }
    else {
LAB_00104cb4:
      puts("\x1b[0;31mFAILED\x1b[0;0m");
      fails = fails + 1;
    }
    freeReplyObject(lVar7);
  }
  if (prVar2->err != 3) {
LAB_00104de9:
    __assert_fail("c->err == REDIS_ERR_EOF && strcmp(c->errstr,\"Server closed the connection\") == 0"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                  ,0x2ab,"void test_blocking_io_errors(struct config)");
  }
  iVar1 = strcmp(prVar2->errstr,"Server closed the connection");
  if (iVar1 != 0) goto LAB_00104de9;
  redisFree(prVar2);
  puVar8 = (undefined8 *)&stack0x00000008;
  puVar9 = &uStackY_88;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar9 = *puVar8;
    puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
  }
  config_01.ssl.key = in_stack_ffffffffffffffd0;
  auVar11 = in_stack_ffffffffffffff80._8_32_;
  config_01.type = in_stack_ffffffffffffff80._0_4_;
  config_01._4_4_ = in_stack_ffffffffffffff80._4_4_;
  config_01.tcp.host = (char *)auVar11._0_8_;
  config_01.tcp.port = auVar11._8_4_;
  config_01.tcp._12_4_ = auVar11._12_4_;
  config_01.tcp.timeout.tv_sec = SUB168(auVar11._16_16_,0);
  config_01.tcp.timeout.tv_usec = SUB168(auVar11._16_16_,8);
  config_01.unix_sock.path = (char *)in_stack_ffffffffffffff80._40_8_;
  config_01.ssl.host = (char *)in_stack_ffffffffffffff80._48_8_;
  config_01.ssl.port = in_stack_ffffffffffffff80._56_4_;
  config_01.ssl._12_4_ = in_stack_ffffffffffffff80._60_4_;
  config_01.ssl.ca_cert = (char *)in_stack_ffffffffffffff80._64_8_;
  config_01.ssl.cert = (char *)in_stack_ffffffffffffff80._72_8_;
  prVar2 = do_connect(config_01);
  tests = tests + 1;
  printf("#%02d ");
  printf("Returns I/O error on socket timeout: ");
  iVar1 = redisSetTimeout(prVar2,0,1000);
  if (iVar1 != 0) {
    __assert_fail("redisSetTimeout(c,tv) == REDIS_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                  ,0x2b1,"void test_blocking_io_errors(struct config)");
  }
  iVar1 = redisGetReply(prVar2,&stack0xffffffffffffffd0);
  if ((iVar1 == -1) && (prVar2->err == 1)) {
    piVar6 = __errno_location();
    if (*piVar6 == 0xb) {
      puts("\x1b[0;32mPASSED\x1b[0;0m");
      goto LAB_00104d95;
    }
  }
  puts("\x1b[0;31mFAILED\x1b[0;0m");
  fails = fails + 1;
LAB_00104d95:
  redisFree(prVar2);
  return;
}

Assistant:

static void test_blocking_io_errors(struct config config) {
    redisContext *c;
    redisReply *reply;
    void *_reply;
    int major, minor;

    /* Connect to target given by config. */
    c = do_connect(config);
    {
        /* Find out Redis version to determine the path for the next test */
        const char *field = "redis_version:";
        char *p, *eptr;

        reply = redisCommand(c,"INFO");
        p = strstr(reply->str,field);
        major = strtol(p+strlen(field),&eptr,10);
        p = eptr+1; /* char next to the first "." */
        minor = strtol(p,&eptr,10);
        freeReplyObject(reply);
    }

    test("Returns I/O error when the connection is lost: ");
    reply = redisCommand(c,"QUIT");
    if (major > 2 || (major == 2 && minor > 0)) {
        /* > 2.0 returns OK on QUIT and read() should be issued once more
         * to know the descriptor is at EOF. */
        test_cond(strcasecmp(reply->str,"OK") == 0 &&
            redisGetReply(c,&_reply) == REDIS_ERR);
        freeReplyObject(reply);
    } else {
        test_cond(reply == NULL);
    }

    /* On 2.0, QUIT will cause the connection to be closed immediately and
     * the read(2) for the reply on QUIT will set the error to EOF.
     * On >2.0, QUIT will return with OK and another read(2) needed to be
     * issued to find out the socket was closed by the server. In both
     * conditions, the error will be set to EOF. */
    assert(c->err == REDIS_ERR_EOF &&
        strcmp(c->errstr,"Server closed the connection") == 0);
    redisFree(c);

    c = do_connect(config);
    test("Returns I/O error on socket timeout: ");
    struct timeval tv = { 0, 1000 };
    assert(redisSetTimeout(c,tv) == REDIS_OK);
    test_cond(redisGetReply(c,&_reply) == REDIS_ERR &&
        c->err == REDIS_ERR_IO && errno == EAGAIN);
    redisFree(c);
}